

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int calculate_scanline_width(spng_ihdr *ihdr,uint32_t width,size_t *scanline_width)

{
  uint uVar1;
  ulong uVar2;
  size_t res;
  size_t *scanline_width_local;
  uint32_t width_local;
  spng_ihdr *ihdr_local;
  
  if ((ihdr == (spng_ihdr *)0x0) || (width == 0)) {
    ihdr_local._4_4_ = 0x50;
  }
  else {
    uVar1 = num_channels(ihdr);
    uVar2 = (ulong)(uVar1 * ihdr->bit_depth);
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / ZEXT416(width),0) < uVar2) {
      ihdr_local._4_4_ = 3;
    }
    else {
      uVar2 = uVar2 * width + 0xf;
      if (uVar2 < 0xf) {
        ihdr_local._4_4_ = 3;
      }
      else {
        uVar2 = uVar2 >> 3;
        if (uVar2 < 0x100000000) {
          *scanline_width = uVar2;
          ihdr_local._4_4_ = 0;
        }
        else {
          ihdr_local._4_4_ = 3;
        }
      }
    }
  }
  return ihdr_local._4_4_;
}

Assistant:

static int calculate_scanline_width(const struct spng_ihdr *ihdr, uint32_t width, size_t *scanline_width)
{
    if(ihdr == NULL || !width) return SPNG_EINTERNAL;

    size_t res = num_channels(ihdr) * ihdr->bit_depth;

    if(res > SIZE_MAX / width) return SPNG_EOVERFLOW;
    res = res * width;

    res += 15; /* Filter byte + 7 for rounding */

    if(res < 15) return SPNG_EOVERFLOW;

    res /= 8;

    if(res > UINT32_MAX) return SPNG_EOVERFLOW;

    *scanline_width = res;

    return 0;
}